

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O2

void __thiscall Block::generate_points(Block *this,size_t n)

{
  float fVar1;
  float fVar2;
  int iVar3;
  size_t i;
  size_t sVar4;
  uint j;
  long lVar5;
  long lVar6;
  
  std::vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>::resize(&this->points,n);
  lVar6 = 0;
  for (sVar4 = 0; sVar4 != n; sVar4 = sVar4 + 1) {
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      fVar1 = (this->domain).min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin
              [lVar5];
      fVar2 = (this->domain).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin
              [lVar5];
      iVar3 = rand();
      *(float *)((long)((this->points).
                        super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->coords + lVar5 * 4 + lVar6) =
           (fVar2 - fVar1) * (float)(iVar3 % 0x400) * 0.0009765625 + fVar1;
    }
    lVar6 = lVar6 + 8;
  }
  return;
}

Assistant:

void            generate_points(size_t n)
  {
    points.resize(n);
    for (size_t i = 0; i < n; ++i)
      for (unsigned j = 0; j < DIM; ++j)
      {
        float min = domain.min[j];
        float max = domain.max[j];
        float u = float(rand() % 1024) / 1024;
        points[i][j] = min + u * (max - min);
      }
  }